

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.h
# Opt level: O0

string * __thiscall
absl::lts_20240722::AsciiStrToLower_abi_cxx11_
          (string *__return_storage_ptr__,lts_20240722 *this,string_view s)

{
  allocator<char> local_22;
  undefined1 local_21;
  undefined1 local_20 [8];
  string_view s_local;
  string *result;
  
  s_local._M_len = s._M_len;
  local_21 = 0;
  local_20 = (undefined1  [8])this;
  s_local._M_str = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)local_20,&local_22);
  std::allocator<char>::~allocator(&local_22);
  absl::lts_20240722::AsciiStrToLower((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string AsciiStrToLower(absl::string_view s) {
  std::string result(s);
  absl::AsciiStrToLower(&result);
  return result;
}